

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O3

bool djgt_to_gl(djg_texture *texture,GLint target,GLint internalformat,bool immutable,bool mipmap,
               GLuint *gl)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  GLboolean GVar4;
  GLenum GVar5;
  int iVar6;
  GLenum GVar7;
  djg_texture *pdVar8;
  ulong uVar9;
  ulong uVar10;
  djg_texture *pdVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  GLsizei GVar15;
  size_t __size;
  uint uVar16;
  int iVar18;
  uint uVar19;
  char *__ptr;
  bool bVar20;
  GLuint glt;
  GLint local_88 [12];
  GLint local_58 [10];
  int iVar17;
  
  if ((texture == (djg_texture *)0x0) || (gl == (GLuint *)0x0)) {
    __assert_fail("texture && gl",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/dj_opengl/dj_opengl.h"
                  ,0x46f,"bool djgt_to_gl(const djg_texture *, GLint, GLint, bool, bool, GLuint *)")
    ;
  }
  (*glad_glGetError)();
  do {
    GVar5 = (*glad_glGetError)();
  } while (GVar5 != 0);
  iVar6 = 1;
  pdVar8 = texture;
  do {
    pdVar8 = pdVar8->next;
    iVar6 = iVar6 + -1;
  } while (pdVar8 != (djg_texture *)0x0);
  if (iVar6 == 0) {
    return false;
  }
  (*glad_glGenTextures)(1,&glt);
  (*glad_glBindTexture)(target,glt);
  if (target < 0x84f7) {
    if (target < 0x8064) {
      if (target != 0xde0) {
        if (target == 0xde1) goto LAB_00165613;
        if (target != 0x8063) goto LAB_00165984;
      }
      iVar6 = texture->next->x;
      if (immutable) {
        iVar17 = 0;
        if (0 < iVar6) {
          iVar17 = iVar6;
        }
        uVar16 = iVar17 - 1;
        uVar9 = 1;
        do {
          uVar16 = (int)uVar16 >> ((byte)uVar9 & 0x1f) | uVar16;
          bVar20 = uVar9 < 0x10;
          uVar9 = uVar9 * 2;
        } while (bVar20);
        GVar15 = 0;
        if ((uVar16 & 1) != 0) {
          GVar15 = 0;
          uVar16 = uVar16 + 1;
          do {
            GVar15 = GVar15 + 1;
            uVar19 = uVar16 & 2;
            uVar16 = (int)uVar16 >> 1;
          } while (uVar19 == 0);
        }
        (*glad_glTexStorage1D)(target,GVar15,internalformat,iVar6);
      }
      else {
        (*glad_glTexImage1D)(target,0,internalformat,iVar6,0,0x1903,0x1401,(void *)0x0);
      }
      pdVar8 = texture->next;
      local_58[4] = 0;
      local_58[5] = 0;
      local_58[6] = 0;
      local_58[7] = 0;
      local_58[0] = 0;
      local_58[1] = 0;
      local_58[2] = 0;
      local_58[3] = 0;
      local_58[8] = 2;
      djgt__get_glpus(local_88);
      iVar6 = bcmp(local_58,local_88,0x24);
      if (iVar6 != 0) {
        djgt__set_glpus(local_58);
      }
      uVar16 = pdVar8->comp - 1;
      GVar7 = 0x500;
      GVar5 = 0x500;
      if (uVar16 < 4) {
        GVar5 = *(GLenum *)(&DAT_001af0c0 + (ulong)uVar16 * 4);
      }
      uVar16 = pdVar8->pf - 1;
      if (uVar16 < 4) {
        GVar7 = *(GLenum *)(&DAT_001af0d0 + (ulong)uVar16 * 4);
      }
      (*glad_glTexSubImage1D)(target,0,0,pdVar8->x,GVar5,GVar7,pdVar8->texels);
      if (iVar6 != 0) {
        djgt__set_glpus(local_88);
      }
      (*glad_glGetError)();
      do {
        GVar5 = (*glad_glGetError)();
      } while (GVar5 != 0);
      bVar20 = true;
    }
    else if (target - 0x806fU < 2) {
      pdVar8 = texture->next;
      uVar16 = pdVar8->x;
      uVar19 = pdVar8->y;
      uVar9 = (ulong)uVar19;
      pdVar11 = pdVar8;
      uVar14 = 0xffffffff;
      do {
        uVar12 = uVar14;
        pdVar11 = pdVar11->next;
        uVar14 = uVar12 + 1;
      } while (pdVar11 != (djg_texture *)0x0);
      uVar12 = uVar12 + 2;
      if (immutable) {
        uVar13 = uVar19;
        if ((int)uVar19 < (int)uVar16) {
          uVar13 = uVar16;
        }
        if ((int)uVar13 <= (int)uVar12) {
          uVar13 = uVar12;
        }
        uVar13 = uVar13 - 1;
        uVar10 = 1;
        do {
          uVar13 = (int)uVar13 >> ((byte)uVar10 & 0x1f) | uVar13;
          bVar20 = uVar10 < 0x10;
          uVar10 = uVar10 * 2;
        } while (bVar20);
        GVar15 = 0;
        if ((uVar13 & 1) != 0) {
          GVar15 = 0;
          uVar13 = uVar13 + 1;
          do {
            GVar15 = GVar15 + 1;
            uVar2 = uVar13 & 2;
            uVar13 = (int)uVar13 >> 1;
          } while (uVar2 == 0);
        }
        uVar10 = (ulong)uVar16;
        (*glad_glTexStorage3D)(target,GVar15,internalformat,uVar16,uVar19,uVar12);
      }
      else {
        uVar10 = (ulong)uVar16;
        (*glad_glTexImage3D)
                  (target,0,internalformat,uVar16,uVar19,uVar12,0,0x1903,0x1401,(void *)0x0);
      }
      uVar16 = 0;
      do {
        bVar20 = djgt__glTexSubImage3D(pdVar8,target,uVar12,(GLint)uVar10,(GLint)uVar9);
        if (uVar14 <= uVar16) break;
        pdVar8 = pdVar8->next;
        uVar16 = uVar16 + 1;
      } while (bVar20);
    }
    else {
      if ((target != 0x8064) && (target != 0x84f5)) goto LAB_00165984;
LAB_00165613:
      iVar6 = texture->next->x;
      iVar17 = texture->next->y;
      if (immutable) {
        iVar1 = iVar17;
        if (iVar17 < iVar6) {
          iVar1 = iVar6;
        }
        iVar18 = 0;
        if (0 < iVar1) {
          iVar18 = iVar1;
        }
        uVar16 = iVar18 - 1;
        uVar9 = 1;
        do {
          uVar16 = (int)uVar16 >> ((byte)uVar9 & 0x1f) | uVar16;
          bVar20 = uVar9 < 0x10;
          uVar9 = uVar9 * 2;
        } while (bVar20);
        GVar15 = 0;
        if ((uVar16 & 1) != 0) {
          GVar15 = 0;
          uVar16 = uVar16 + 1;
          do {
            GVar15 = GVar15 + 1;
            uVar19 = uVar16 & 2;
            uVar16 = (int)uVar16 >> 1;
          } while (uVar19 == 0);
        }
        (*glad_glTexStorage2D)(target,GVar15,internalformat,iVar6,iVar17);
      }
      else {
        (*glad_glTexImage2D)(target,0,internalformat,iVar6,iVar17,0,0x1903,0x1401,(void *)0x0);
      }
      bVar20 = djgt__glTexSubImage2D(texture->next,target,0,iVar6);
    }
  }
  else if (target < 0x8c1a) {
    if (target - 0x8c18U < 2) {
      pdVar8 = texture->next;
      uVar16 = pdVar8->x;
      if (immutable) {
        uVar19 = 0;
        if (0 < (int)uVar16) {
          uVar19 = uVar16;
        }
        uVar19 = uVar19 - 1;
        uVar9 = 1;
        do {
          uVar19 = (int)uVar19 >> ((byte)uVar9 & 0x1f) | uVar19;
          bVar20 = uVar9 < 0x10;
          uVar9 = uVar9 * 2;
        } while (bVar20);
        GVar15 = 0;
        if ((uVar19 & 1) != 0) {
          GVar15 = 0;
          uVar19 = uVar19 + 1;
          do {
            GVar15 = GVar15 + 1;
            uVar14 = uVar19 & 2;
            uVar19 = (int)uVar19 >> 1;
          } while (uVar14 == 0);
        }
        iVar6 = -1;
        pdVar11 = texture;
        do {
          pdVar11 = pdVar11->next;
          iVar6 = iVar6 + 1;
        } while (pdVar11 != (djg_texture *)0x0);
        uVar9 = (ulong)uVar16;
        (*glad_glTexStorage2D)(target,GVar15,internalformat,uVar16,iVar6);
      }
      else {
        iVar6 = 0;
        pdVar11 = pdVar8;
        do {
          iVar6 = iVar6 + 1;
          pdVar11 = pdVar11->next;
        } while (pdVar11 != (djg_texture *)0x0);
        uVar9 = (ulong)uVar16;
        (*glad_glTexImage2D)(target,0,internalformat,uVar16,iVar6,0,0x1903,0x1401,(void *)0x0);
      }
      if (pdVar8 == (djg_texture *)0x0) {
        bVar20 = true;
      }
      else {
        iVar6 = 0;
        bVar20 = true;
        do {
          pdVar8 = pdVar8->next;
          bVar3 = djgt__glTexSubImage2D(texture->next,target,iVar6,(GLint)uVar9);
          bVar20 = (bool)(bVar20 & bVar3);
          iVar6 = iVar6 + 1;
        } while (pdVar8 != (djg_texture *)0x0);
      }
    }
    else {
      if (target == 0x84f7) goto LAB_00165613;
      if (target != 0x8513) goto LAB_00165984;
      pdVar8 = texture->next;
      uVar16 = pdVar8->x;
      uVar19 = pdVar8->y;
      if (immutable) {
        uVar14 = uVar19;
        if ((int)uVar19 < (int)uVar16) {
          uVar14 = uVar16;
        }
        uVar12 = 0;
        if (0 < (int)uVar14) {
          uVar12 = uVar14;
        }
        uVar12 = uVar12 - 1;
        uVar9 = 1;
        do {
          uVar12 = (int)uVar12 >> ((byte)uVar9 & 0x1f) | uVar12;
          bVar20 = uVar9 < 0x10;
          uVar9 = uVar9 * 2;
        } while (bVar20);
        GVar15 = 0;
        if ((uVar12 & 1) != 0) {
          GVar15 = 0;
          uVar14 = uVar12 + 1;
          do {
            GVar15 = GVar15 + 1;
            uVar12 = uVar14 & 2;
            uVar14 = (int)uVar14 >> 1;
          } while (uVar12 == 0);
        }
        uVar9 = (ulong)uVar16;
        (*glad_glTexStorage2D)(0x8513,GVar15,internalformat,uVar16,uVar19);
      }
      else {
        GVar5 = 0x8515;
        do {
          uVar9 = (ulong)uVar16;
          (*glad_glTexImage2D)(GVar5,0,internalformat,uVar16,uVar19,0,0x1903,0x1401,(void *)0x0);
          GVar5 = GVar5 + 1;
        } while (GVar5 != 0x851b);
      }
      if (pdVar8 == (djg_texture *)0x0) {
        bVar20 = true;
      }
      else {
        uVar16 = 0;
        bVar20 = true;
        do {
          if ((bVar20 == false) ||
             (bVar20 = djgt__glTexSubImage2D(pdVar8,uVar16 + 0x8515,0,(GLint)uVar9), 4 < uVar16))
          break;
          pdVar8 = pdVar8->next;
          uVar16 = uVar16 + 1;
        } while (pdVar8 != (djg_texture *)0x0);
      }
    }
  }
  else {
    if (1 < target - 0x8c1aU) {
LAB_00165984:
      __ptr = "djg_error: Unsupported GL texture target\n";
      __size = 0x29;
      goto LAB_00165bc8;
    }
    pdVar8 = texture->next;
    uVar16 = pdVar8->x;
    uVar19 = pdVar8->y;
    uVar9 = (ulong)uVar19;
    pdVar11 = pdVar8;
    uVar14 = 0xffffffff;
    do {
      uVar12 = uVar14;
      pdVar11 = pdVar11->next;
      uVar14 = uVar12 + 1;
    } while (pdVar11 != (djg_texture *)0x0);
    iVar6 = uVar12 + 2;
    if (immutable) {
      uVar12 = uVar19;
      if ((int)uVar19 < (int)uVar16) {
        uVar12 = uVar16;
      }
      uVar13 = 0;
      if (0 < (int)uVar12) {
        uVar13 = uVar12;
      }
      uVar13 = uVar13 - 1;
      uVar10 = 1;
      do {
        uVar13 = (int)uVar13 >> ((byte)uVar10 & 0x1f) | uVar13;
        bVar20 = uVar10 < 0x10;
        uVar10 = uVar10 * 2;
      } while (bVar20);
      GVar15 = 0;
      if ((uVar13 & 1) != 0) {
        GVar15 = 0;
        uVar12 = uVar13 + 1;
        do {
          GVar15 = GVar15 + 1;
          uVar13 = uVar12 & 2;
          uVar12 = (int)uVar12 >> 1;
        } while (uVar13 == 0);
      }
      uVar10 = (ulong)uVar16;
      (*glad_glTexStorage3D)(target,GVar15,internalformat,uVar16,uVar19,iVar6);
    }
    else {
      uVar10 = (ulong)uVar16;
      (*glad_glTexImage3D)(target,0,internalformat,uVar16,uVar19,iVar6,0,0x1903,0x1401,(void *)0x0);
    }
    uVar16 = 0;
    do {
      bVar20 = djgt__glTexSubImage3D(pdVar8,target,uVar16,(GLint)uVar10,(GLint)uVar9);
      if (uVar14 <= uVar16) break;
      pdVar8 = pdVar8->next;
      uVar16 = uVar16 + 1;
    } while (bVar20);
  }
  if ((mipmap) && (bVar20 != false)) {
    (*glad_glGenerateMipmap)(target);
  }
  GVar5 = (*glad_glGetError)();
  do {
    GVar7 = (*glad_glGetError)();
  } while (GVar7 != 0);
  if ((GVar5 == 0) && (bVar20 != false)) {
    GVar4 = (*glad_glIsTexture)(*gl);
    if (GVar4 != '\0') {
      (*glad_glDeleteTextures)(1,gl);
    }
    *gl = glt;
    return true;
  }
  __ptr = "djg_error: Caught OpenGL error\n";
  __size = 0x1f;
LAB_00165bc8:
  fwrite(__ptr,__size,1,_stdout);
  fflush(_stdout);
  return false;
}

Assistant:

DJGDEF bool
djgt_to_gl(
    const djg_texture *texture,
    GLint target,
    GLint internalformat,
    bool immutable,
    bool mipmap,
    GLuint *gl
) {
    bool v = true;
    GLuint glt;

    DJG_ASSERT(texture && gl);
    djgt__validate(); // flush previous OpenGL errors

    if (!djgt__count(texture)) return false;
    glGenTextures(1, &glt);
    glBindTexture(target, glt);
    switch (target) {
        /*************************************************************/
        /***/
        /***/
        // 1D
        case GL_TEXTURE_1D:
        case GL_PROXY_TEXTURE_1D: {
            int x = texture->next->x;

#ifndef NGL_ARB_texture_storage
            if (immutable) {
                glTexStorage1D(target,
                               djgt__mipcnt(x, 0, 0),
                               internalformat,
                               x);
            } else
#endif // NGL_ARB_texture_storage
            {
                glTexImage1D(target,
                    /*level*/0,
                             internalformat,
                             x,
                   /*border*/0,
                    /*dummy*/GL_RED, GL_UNSIGNED_BYTE, NULL);
            }
            djgt__glTexSubImage1D(texture->next, target, /*xoffset*/0);
        } break;

        /*************************************************************/
        /***/
        /***/
        // 1D_ARRAY
        case GL_TEXTURE_1D_ARRAY:
        case GL_PROXY_TEXTURE_1D_ARRAY: {
            int x = texture->next->x;
            int i = 0;
            const djg_texture *it = texture->next;

#ifndef NGL_ARB_texture_storage
            if (immutable) {
                glTexStorage2D(target,
                               djgt__mipcnt(x, 0, 0),
                               internalformat,
                               x,
                               djgt__count(texture));
            } else
#endif // NGL_ARB_texture_storage
            {
                glTexImage2D(target,
                    /*level*/0,
                             internalformat,
                             x,
                             djgt__count(texture),
                   /*border*/0,
                    /*dummy*/GL_RED, GL_UNSIGNED_BYTE, NULL);
            }
            while (it) {
                it = it->next;
                v&= djgt__glTexSubImage2D(texture->next,
                                          target,
                               /*offsets*/0, i);
                ++i;
            }
        } break;

        /*************************************************************/
        /***/
        /***/
        // 2D
        case GL_TEXTURE_2D:
        case GL_TEXTURE_RECTANGLE:
        case GL_PROXY_TEXTURE_2D:
        case GL_PROXY_TEXTURE_RECTANGLE: {
            int x = texture->next->x;
            int y = texture->next->y;
#ifndef NGL_ARB_texture_storage
            if (immutable) {
                glTexStorage2D(target,
                               djgt__mipcnt(x, y, 0),
                               internalformat,
                               x,
                               y);
            } else
#endif // NGL_ARB_texture_storage
            {
                glTexImage2D(target,
                    /*level*/0,
                             internalformat,
                             x,
                             y,
                   /*border*/0,
                    /*dummy*/GL_RED, GL_UNSIGNED_BYTE, NULL);
            }
            v&= djgt__glTexSubImage2D(texture->next, target, /*offsets*/0, 0);
        } break;

        /*************************************************************/
        /***/
        /***/
        // CUBEMAP
        case GL_TEXTURE_CUBE_MAP: {
            int x = texture->next->x;
            int y = texture->next->y;
            const djg_texture *it = texture->next;
            int i;

#ifndef NGL_ARB_texture_storage
            if (immutable) {
                glTexStorage2D(target,
                               djgt__mipcnt(x, y, 0),
                               internalformat,
                               x,
                               y);
            } else
#endif // NGL_ARB_texture_storage
            {
                for (i = 0; i < 6; ++i)
                    glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X + i,
                                 0, internalformat, x, y, 0,
                        /*dummy*/GL_RED, GL_UNSIGNED_BYTE, NULL);
            }
            for (i = 0; i < 6 && it && v; ++i) {
                v&= djgt__glTexSubImage2D(it,
                                          GL_TEXTURE_CUBE_MAP_POSITIVE_X + i,
                               /*offsets*/0, 0);
                it = it->next;
            }
        } break;

        /*************************************************************/
        /***/
        /***/
        // 2D_ARRAY
        case GL_TEXTURE_2D_ARRAY:
        case GL_PROXY_TEXTURE_2D_ARRAY: {
            int x = texture->next->x;
            int y = texture->next->y;
            int z = djgt__count(texture);
            const djg_texture *it = texture->next;
            int i;

#ifndef NGL_ARB_texture_storage
            if (immutable) {
                glTexStorage3D(target,
                               djgt__mipcnt(x, y, 0),
                               internalformat,
                               x,
                               y,
                               z);
            } else
#endif // NGL_ARB_texture_storage
            {
                glTexImage3D(target, 0, internalformat, x, y, z, 0,
                    /*dummy*/GL_RED, GL_UNSIGNED_BYTE, NULL);
            }
            for (i = 0; i < z && v; ++i) {
                v&= djgt__glTexSubImage3D(it,
                                          target,
                               /*offsets*/0, 0, i);
                it = it->next;
            }
        } break;

        /*************************************************************/
        /***/
        /***/
        // 3D
        case GL_TEXTURE_3D:
        case GL_PROXY_TEXTURE_3D: {
            int x = texture->next->x;
            int y = texture->next->y;
            int z = djgt__count(texture);
            const djg_texture *it = texture->next;
            int i;

#ifndef NGL_ARB_texture_storage
            if (immutable) {
                glTexStorage3D(target,
                               djgt__mipcnt(x, y, z),
                               internalformat,
                               x,
                               y,
                               z);
            } else
#endif // NGL_ARB_texture_storage
            {
                glTexImage3D(target, 0, internalformat, x, y, z, 0,
                    /*dummy*/GL_RED, GL_UNSIGNED_BYTE, NULL);
            }
            for (i = 0; i < z && v; ++i) {
                v&= djgt__glTexSubImage3D(it,
                                          target,
                               /*offsets*/0, 0, z);
                it = it->next;
            }
        } break;

        /*************************************************************/
        /***/
        /***/
        // Error
        default:
            DJG_LOG("djg_error: Unsupported GL texture target\n");

            return false;
            break;
    }

    if (mipmap && v) glGenerateMipmap(target);

    if (!(v&= djgt__validate())) {
        DJG_LOG("djg_error: Caught OpenGL error\n");

        return false;
    }

    if (glIsTexture(*gl)) glDeleteTextures(1, gl);
    *gl = glt;

    return true;
}